

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_frame.c
# Opt level: O2

void nghttp2_frame_origin_init(nghttp2_extension *frame,nghttp2_origin_entry *ov,size_t nov)

{
  size_t sVar1;
  size_t *psVar2;
  size_t sVar3;
  bool bVar4;
  
  psVar2 = &ov->origin_len;
  sVar1 = 0;
  sVar3 = nov;
  while (bVar4 = sVar3 != 0, sVar3 = sVar3 - 1, bVar4) {
    sVar1 = sVar1 + *psVar2 + 2;
    psVar2 = psVar2 + 2;
  }
  (frame->hd).length = sVar1;
  (frame->hd).type = '\f';
  (frame->hd).flags = '\0';
  (frame->hd).stream_id = 0;
  (frame->hd).reserved = '\0';
  psVar2 = (size_t *)frame->payload;
  psVar2[1] = (size_t)ov;
  *psVar2 = nov;
  return;
}

Assistant:

void nghttp2_frame_origin_init(nghttp2_extension *frame,
                               nghttp2_origin_entry *ov, size_t nov) {
  nghttp2_ext_origin *origin;
  size_t payloadlen = 0;
  size_t i;

  for (i = 0; i < nov; ++i) {
    payloadlen += 2 + ov[i].origin_len;
  }

  nghttp2_frame_hd_init(&frame->hd, payloadlen, NGHTTP2_ORIGIN,
                        NGHTTP2_FLAG_NONE, 0);

  origin = frame->payload;
  origin->ov = ov;
  origin->nov = nov;
}